

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::FramebufferMinimumValueCase::iterate
          (FramebufferMinimumValueCase *this)

{
  GLenum GVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  int *piVar7;
  Enum<int,_2UL> EVar8;
  GetNameFunc local_278;
  int local_270;
  string local_268;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  GLenum local_1c0;
  undefined1 local_1bc [4];
  deUint32 err;
  StateQueryMemoryWriteGuard<int> tiedToValue;
  GetNameFunc local_1a0;
  int local_198;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_149;
  string local_148;
  ScopedLogSection local_128;
  ScopedLogSection section_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  FramebufferMinimumValueCase *this_local;
  
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar6);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar6,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Minimum",&local_d9);
  de::toString<int>((string *)&section_1,&this->m_minValue);
  std::operator+(&local_100,"Specified minimum is ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section_1);
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar6,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  gls::StateQueryUtil::verifyStateIntegerMin
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             this->m_target,this->m_minValue,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Ties",&local_149);
  EVar8 = glu::getGettableStateStr(this->m_tiedTo);
  tiedToValue._4_8_ = EVar8.m_getName;
  local_198 = EVar8.m_value;
  local_1a0 = (GetNameFunc)tiedToValue._4_8_;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_190,(de *)&local_1a0,EVar8._8_8_);
  std::operator+(&local_170,"The limit is tied to the value of ",&local_190);
  tcu::ScopedLogSection::ScopedLogSection(&local_128,pTVar6,&local_148,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_1bc);
  GVar1 = this->m_tiedTo;
  piVar7 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_1bc);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),GVar1,piVar7);
  do {
    local_1c0 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_1c0 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"Got Error ",&local_241);
      EVar8 = glu::getErrorStr(local_1c0);
      local_278 = EVar8.m_getName;
      local_270 = EVar8.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_278);
      std::operator+(&local_220,&local_240,&local_268);
      std::operator+(&local_200,&local_220,": ");
      std::operator+(&local_1e0,&local_200,"glGetIntegerv");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  bVar2 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_1bc,(ResultCollector *)local_78);
  if (bVar2) {
    GVar1 = this->m_target;
    piVar7 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_1bc);
    gls::StateQueryUtil::verifyStateIntegerMin
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               GVar1,*piVar7,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_128);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

FramebufferMinimumValueCase::IterateResult FramebufferMinimumValueCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Minimum", "Specified minimum is " + de::toString(m_minValue));

		verifyStateIntegerMin(result, gl, m_target, m_minValue, m_verifierType);
	}
	{
		const tcu::ScopedLogSection				section		(m_testCtx.getLog(), "Ties", "The limit is tied to the value of " + de::toString(glu::getGettableStateStr(m_tiedTo)));
		StateQueryMemoryWriteGuard<glw::GLint>	tiedToValue;

		gl.glGetIntegerv(m_tiedTo, &tiedToValue);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

		if (tiedToValue.verifyValidity(result))
			verifyStateIntegerMin(result, gl, m_target, tiedToValue, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}